

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::anon_unknown_5::DecFmtSymDataSink::put
          (DecFmtSymDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  DecimalFormatSymbols *this_00;
  char *__s1;
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int i;
  ulong uVar3;
  undefined **ppuVar4;
  int32_t len;
  ResourceTable symbolsTable;
  int32_t local_cc;
  char *local_c8;
  ConstChar16Ptr local_c0;
  UErrorCode *local_b8;
  DecFmtSymDataSink *local_b0;
  char16_t *local_a8;
  ResourceTable local_98;
  UnicodeString local_70;
  
  local_c8 = key;
  local_b0 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_98,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i = 0;
    local_b8 = errorCode;
    cVar1 = ResourceTable::getKeyAndValue(&local_98,0,&local_c8,value);
    __s1 = local_c8;
    while (cVar1 != '\0') {
      ppuVar4 = &gNumberElementKeys;
      uVar3 = 0;
      local_c8 = __s1;
      do {
        if (((0x7fd2334UL >> (uVar3 & 0x3f) & 1) == 0) &&
           (iVar2 = strcmp(__s1,*ppuVar4), iVar2 == 0)) {
          if (local_b0->seenSymbol[uVar3] == '\0') {
            local_b0->seenSymbol[uVar3] = '\x01';
            this_00 = local_b0->dfs;
            local_cc = 0;
            iVar2 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_cc,local_b8);
            local_c0.p_ = (char16_t *)CONCAT44(extraout_var,iVar2);
            icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_c0,local_cc);
            local_a8 = local_c0.p_;
            DecimalFormatSymbols::setSymbol(this_00,(ENumberFormatSymbol)uVar3,&local_70,'\x01');
            icu_63::UnicodeString::~UnicodeString(&local_70);
            if (U_ZERO_ERROR < *local_b8) {
              return;
            }
          }
          break;
        }
        uVar3 = uVar3 + 1;
        ppuVar4 = ppuVar4 + 1;
      } while (uVar3 != 0x1c);
      i = i + 1;
      cVar1 = ResourceTable::getKeyAndValue(&local_98,i,&local_c8,value);
      __s1 = local_c8;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable symbolsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t j = 0; symbolsTable.getKeyAndValue(j, key, value); ++j) {
            for (int32_t i=0; i<DecimalFormatSymbols::kFormatSymbolCount; i++) {
                if (gNumberElementKeys[i] != NULL && uprv_strcmp(key, gNumberElementKeys[i]) == 0) {
                    if (!seenSymbol[i]) {
                        seenSymbol[i] = TRUE;
                        dfs.setSymbol(
                            (DecimalFormatSymbols::ENumberFormatSymbol) i,
                            value.getUnicodeString(errorCode));
                        if (U_FAILURE(errorCode)) { return; }
                    }
                    break;
                }
            }
        }
    }